

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O0

bool __thiscall
ON_ObjRefEvaluationParameter::Read(ON_ObjRefEvaluationParameter *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool local_29;
  int local_28;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_ObjRefEvaluationParameter *this_local;
  
  _minor_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  Default(this);
  iStack_24 = 0;
  local_28 = 0;
  this_local._7_1_ =
       ON_BinaryArchive::BeginRead3dmChunk
                 (_minor_version,0x40008000,&stack0xffffffffffffffdc,&local_28);
  if (this_local._7_1_) {
    local_29 = iStack_24 == 1;
    if ((((local_29) &&
         (local_29 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_t_type), local_29)) &&
        (local_29 = ON_BinaryArchive::ReadComponentIndex(_minor_version,&this->m_t_ci), local_29))
       && (((local_29 = ON_BinaryArchive::ReadDouble(_minor_version,4,this->m_t), local_29 &&
            (local_29 = ON_BinaryArchive::ReadInterval
                                  (_minor_version,(ON_Interval *)&this->field_0x28), local_29)) &&
           (local_29 = ON_BinaryArchive::ReadInterval
                                 (_minor_version,(ON_Interval *)&this->field_0x38), local_29)))) {
      local_29 = ON_BinaryArchive::ReadInterval(_minor_version,(ON_Interval *)&this->field_0x48);
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      local_29 = false;
    }
    this_local._7_1_ = local_29;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ObjRefEvaluationParameter::Read( ON_BinaryArchive& archive )
{
  Default();

  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return rc;

  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    rc = archive.ReadInt(&m_t_type);
    if (!rc) break;

    rc = archive.ReadComponentIndex(m_t_ci);
    if (!rc) break;

    rc = archive.ReadDouble(4,m_t);
    if (!rc) break;

    rc = archive.ReadInterval(m_s[0]);
    if (!rc) break;

    rc = archive.ReadInterval(m_s[1]);
    if (!rc) break;

    rc = archive.ReadInterval(m_s[2]);
    if (!rc) break;

    break;
  }

  if ( !archive.EndRead3dmChunk() )
    rc = false;

  return rc;
}